

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::OccLists(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
           *this,undefined8 *d)

{
  WatcherDeleted *d_local;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  *this_local;
  
  IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>::IntMap();
  IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::IntMap();
  vec<Minisat::Lit,_int>::vec(&this->dirties);
  (this->deleted).ca = (ClauseAllocator *)*d;
  return;
}

Assistant:

OccLists(const Deleted& d, MkIndex _index = MkIndex()) :
        occs(_index), 
        dirty(_index), 
        deleted(d){}